

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O3

void stack_restore_add(int saved_size,atom a)

{
  atom a_00;
  
  stack_size = (size_t)saved_size;
  if (stack_size < stack_capacity >> 2) {
    stack_capacity = stack_size * 2;
    stack = (atom *)realloc(stack,stack_size << 5);
  }
  a_00._0_8_ = a._0_8_ & 0xffffffff;
  a_00.value.number = a.value.number;
  stack_add(a_00);
  return;
}

Assistant:

void stack_restore_add(int saved_size, atom a) {
	stack_size = saved_size;
	/* if there is waste of memory, realloc */
	if (stack_size < stack_capacity / 4) {
		stack_capacity = stack_size * 2;
		stack = realloc(stack, stack_capacity * sizeof(atom));
	}
	stack_add(a);
}